

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_init.c
# Opt level: O0

GLFWbool initExtensions(void)

{
  int iVar1;
  char local_48 [8];
  char name [32];
  XkbStateRec state;
  int supported;
  XRRScreenResources *sr;
  
  _glfw.x11.vidmode.handle = (void *)dlopen("libXxf86vm.so.1",1);
  if (_glfw.x11.vidmode.handle != (void *)0x0) {
    _glfw.x11.vidmode.QueryExtension =
         (PFN_XF86VidModeQueryExtension)dlsym(_glfw.x11.vidmode.handle,"XF86VidModeQueryExtension");
    _glfw.x11.vidmode.GetGammaRamp =
         (PFN_XF86VidModeGetGammaRamp)dlsym(_glfw.x11.vidmode.handle,"XF86VidModeGetGammaRamp");
    _glfw.x11.vidmode.SetGammaRamp =
         (PFN_XF86VidModeSetGammaRamp)dlsym(_glfw.x11.vidmode.handle,"XF86VidModeSetGammaRamp");
    _glfw.x11.vidmode.GetGammaRampSize =
         (PFN_XF86VidModeGetGammaRampSize)
         dlsym(_glfw.x11.vidmode.handle,"XF86VidModeGetGammaRampSize");
    _glfw.x11.vidmode.available =
         (*_glfw.x11.vidmode.QueryExtension)(_glfw.x11.display,(int *)0x184820,(int *)0x184824);
  }
  _glfw.x11.xi.handle = (void *)dlopen("libXi.so.6",1);
  if (_glfw.x11.xi.handle != (void *)0x0) {
    _glfw.x11.xi.QueryVersion = (PFN_XIQueryVersion)dlsym(_glfw.x11.xi.handle,"XIQueryVersion");
    _glfw.x11.xi.SelectEvents = (PFN_XISelectEvents)dlsym(_glfw.x11.xi.handle,"XISelectEvents");
    iVar1 = XQueryExtension(_glfw.x11.display,"XInputExtension",0x184858,0x18485c,0x184860);
    if (iVar1 != 0) {
      _glfw.x11.xi.major = 2;
      _glfw.x11.xi.minor = 0;
      iVar1 = (*_glfw.x11.xi.QueryVersion)(_glfw.x11.display,(int *)0x184864,(int *)0x184868);
      if (iVar1 == 0) {
        _glfw.x11.xi.available = 1;
      }
    }
  }
  _glfw.x11.randr.handle = (void *)dlopen("libXrandr.so.2",1);
  if (_glfw.x11.randr.handle != (void *)0x0) {
    _glfw.x11.randr.AllocGamma = (PFN_XRRAllocGamma)dlsym(_glfw.x11.randr.handle,"XRRAllocGamma");
    _glfw.x11.randr.FreeGamma = (PFN_XRRFreeGamma)dlsym(_glfw.x11.randr.handle,"XRRFreeGamma");
    _glfw.x11.randr.FreeCrtcInfo =
         (PFN_XRRFreeCrtcInfo)dlsym(_glfw.x11.randr.handle,"XRRFreeCrtcInfo");
    _glfw.x11.randr.FreeGamma = (PFN_XRRFreeGamma)dlsym(_glfw.x11.randr.handle,"XRRFreeGamma");
    _glfw.x11.randr.FreeOutputInfo =
         (PFN_XRRFreeOutputInfo)dlsym(_glfw.x11.randr.handle,"XRRFreeOutputInfo");
    _glfw.x11.randr.FreeScreenResources =
         (PFN_XRRFreeScreenResources)dlsym(_glfw.x11.randr.handle,"XRRFreeScreenResources");
    _glfw.x11.randr.GetCrtcGamma =
         (PFN_XRRGetCrtcGamma)dlsym(_glfw.x11.randr.handle,"XRRGetCrtcGamma");
    _glfw.x11.randr.GetCrtcGammaSize =
         (PFN_XRRGetCrtcGammaSize)dlsym(_glfw.x11.randr.handle,"XRRGetCrtcGammaSize");
    _glfw.x11.randr.GetCrtcInfo = (PFN_XRRGetCrtcInfo)dlsym(_glfw.x11.randr.handle,"XRRGetCrtcInfo")
    ;
    _glfw.x11.randr.GetOutputInfo =
         (PFN_XRRGetOutputInfo)dlsym(_glfw.x11.randr.handle,"XRRGetOutputInfo");
    _glfw.x11.randr.GetOutputPrimary =
         (PFN_XRRGetOutputPrimary)dlsym(_glfw.x11.randr.handle,"XRRGetOutputPrimary");
    _glfw.x11.randr.GetScreenResourcesCurrent =
         (PFN_XRRGetScreenResourcesCurrent)
         dlsym(_glfw.x11.randr.handle,"XRRGetScreenResourcesCurrent");
    _glfw.x11.randr.QueryExtension =
         (PFN_XRRQueryExtension)dlsym(_glfw.x11.randr.handle,"XRRQueryExtension");
    _glfw.x11.randr.QueryVersion =
         (PFN_XRRQueryVersion)dlsym(_glfw.x11.randr.handle,"XRRQueryVersion");
    _glfw.x11.randr.SelectInput = (PFN_XRRSelectInput)dlsym(_glfw.x11.randr.handle,"XRRSelectInput")
    ;
    _glfw.x11.randr.SetCrtcConfig =
         (PFN_XRRSetCrtcConfig)dlsym(_glfw.x11.randr.handle,"XRRSetCrtcConfig");
    _glfw.x11.randr.SetCrtcGamma =
         (PFN_XRRSetCrtcGamma)dlsym(_glfw.x11.randr.handle,"XRRSetCrtcGamma");
    _glfw.x11.randr.UpdateConfiguration =
         (PFN_XRRUpdateConfiguration)dlsym(_glfw.x11.randr.handle,"XRRUpdateConfiguration");
    iVar1 = (*_glfw.x11.randr.QueryExtension)(_glfw.x11.display,(int *)0x1846c0,(int *)0x1846c4);
    if (iVar1 != 0) {
      iVar1 = (*_glfw.x11.randr.QueryVersion)(_glfw.x11.display,(int *)0x1846c8,(int *)0x1846cc);
      if (iVar1 == 0) {
        _glfwInputError(0x10008,"X11: Failed to query RandR version");
      }
      else if ((1 < _glfw.x11.randr.major) || (2 < _glfw.x11.randr.minor)) {
        _glfw.x11.randr.available = 1;
      }
    }
  }
  if (_glfw.x11.randr.available != 0) {
    register0x00000000 =
         (*_glfw.x11.randr.GetScreenResourcesCurrent)(_glfw.x11.display,_glfw.x11.root);
    if ((register0x00000000->ncrtc == 0) ||
       (iVar1 = (*_glfw.x11.randr.GetCrtcGammaSize)(_glfw.x11.display,*register0x00000000->crtcs),
       iVar1 == 0)) {
      _glfw.x11.randr.gammaBroken = 1;
    }
    if (stack0xfffffffffffffff0->ncrtc == 0) {
      _glfw.x11.randr.monitorBroken = 1;
    }
    (*_glfw.x11.randr.FreeScreenResources)(stack0xfffffffffffffff0);
  }
  if ((_glfw.x11.randr.available != 0) && (_glfw.x11.randr.monitorBroken == 0)) {
    (*_glfw.x11.randr.SelectInput)(_glfw.x11.display,_glfw.x11.root,4);
  }
  _glfw.x11.xcursor.handle = (void *)dlopen("libXcursor.so.1",1);
  if (_glfw.x11.xcursor.handle != (void *)0x0) {
    _glfw.x11.xcursor.ImageCreate =
         (PFN_XcursorImageCreate)dlsym(_glfw.x11.xcursor.handle,"XcursorImageCreate");
    _glfw.x11.xcursor.ImageDestroy =
         (PFN_XcursorImageDestroy)dlsym(_glfw.x11.xcursor.handle,"XcursorImageDestroy");
    _glfw.x11.xcursor.ImageLoadCursor =
         (PFN_XcursorImageLoadCursor)dlsym(_glfw.x11.xcursor.handle,"XcursorImageLoadCursor");
  }
  _glfw.x11.xinerama.handle = (void *)dlopen("libXinerama.so.1",1);
  if (_glfw.x11.xinerama.handle != (void *)0x0) {
    _glfw.x11.xinerama.IsActive =
         (PFN_XineramaIsActive)dlsym(_glfw.x11.xinerama.handle,"XineramaIsActive");
    _glfw.x11.xinerama.QueryExtension =
         (PFN_XineramaQueryExtension)dlsym(_glfw.x11.xinerama.handle,"XineramaQueryExtension");
    _glfw.x11.xinerama.QueryScreens =
         (PFN_XineramaQueryScreens)dlsym(_glfw.x11.xinerama.handle,"XineramaQueryScreens");
    iVar1 = (*_glfw.x11.xinerama.QueryExtension)(_glfw.x11.display,(int *)0x1847e0,(int *)0x1847e4);
    if ((iVar1 != 0) && (iVar1 = (*_glfw.x11.xinerama.IsActive)(_glfw.x11.display), iVar1 != 0)) {
      _glfw.x11.xinerama.available = 1;
    }
  }
  _glfw.x11.xkb.major = 1;
  _glfw.x11.xkb.minor = 0;
  _glfw.x11.xkb.available =
       XkbQueryExtension(_glfw.x11.display,0x184768,0x18476c,0x184770,0x184774,0x184778);
  if (_glfw.x11.xkb.available != 0) {
    iVar1 = XkbSetDetectableAutoRepeat(_glfw.x11.display,1,&state.compat_state);
    if ((iVar1 != 0) && (state._10_4_ != 0)) {
      _glfw.x11.xkb.detectable = 1;
    }
    _glfw.x11.xkb.group = 0;
    iVar1 = XkbGetState(_glfw.x11.display,0x100,name + 0x1a);
    if (iVar1 == 0) {
      XkbSelectEventDetails(_glfw.x11.display,0x100,2,0x3fff,0x10);
      _glfw.x11.xkb.group = (uint)(byte)name[0x1a];
    }
  }
  _glfw.x11.x11xcb.handle = (void *)dlopen("libX11-xcb.so.1",1);
  if (_glfw.x11.x11xcb.handle != (void *)0x0) {
    _glfw.x11.x11xcb.GetXCBConnection =
         (PFN_XGetXCBConnection)dlsym(_glfw.x11.x11xcb.handle,"XGetXCBConnection");
  }
  _glfw.x11.xrender.handle = (void *)dlopen("libXrender.so.1",1);
  if (_glfw.x11.xrender.handle != (void *)0x0) {
    _glfw.x11.xrender.QueryExtension =
         (PFN_XRenderQueryExtension)dlsym(_glfw.x11.xrender.handle,"XRenderQueryExtension");
    _glfw.x11.xrender.QueryVersion =
         (PFN_XRenderQueryVersion)dlsym(_glfw.x11.xrender.handle,"XRenderQueryVersion");
    _glfw.x11.xrender.FindVisualFormat =
         (PFN_XRenderFindVisualFormat)dlsym(_glfw.x11.xrender.handle,"XRenderFindVisualFormat");
    iVar1 = (*_glfw.x11.xrender.QueryExtension)(_glfw.x11.display,(int *)0x18489c,(int *)0x184898);
    if ((iVar1 != 0) &&
       (iVar1 = (*_glfw.x11.xrender.QueryVersion)(_glfw.x11.display,(int *)0x184890,(int *)0x184894)
       , iVar1 != 0)) {
      _glfw.x11.xrender.available = 1;
    }
  }
  createKeyTables();
  _glfw.x11.NULL_ = XInternAtom(_glfw.x11.display,"NULL",0);
  _glfw.x11.UTF8_STRING = XInternAtom(_glfw.x11.display,"UTF8_STRING",0);
  _glfw.x11.ATOM_PAIR = XInternAtom(_glfw.x11.display,"ATOM_PAIR",0);
  _glfw.x11.GLFW_SELECTION = XInternAtom(_glfw.x11.display,"GLFW_SELECTION",0);
  _glfw.x11.TARGETS = XInternAtom(_glfw.x11.display,"TARGETS",0);
  _glfw.x11.MULTIPLE = XInternAtom(_glfw.x11.display,"MULTIPLE",0);
  _glfw.x11.PRIMARY = XInternAtom(_glfw.x11.display,"PRIMARY",0);
  _glfw.x11.INCR = XInternAtom(_glfw.x11.display,"INCR",0);
  _glfw.x11.CLIPBOARD = XInternAtom(_glfw.x11.display,"CLIPBOARD",0);
  _glfw.x11.CLIPBOARD_MANAGER = XInternAtom(_glfw.x11.display,"CLIPBOARD_MANAGER",0);
  _glfw.x11.SAVE_TARGETS = XInternAtom(_glfw.x11.display,"SAVE_TARGETS",0);
  _glfw.x11.XdndAware = XInternAtom(_glfw.x11.display,"XdndAware",0);
  _glfw.x11.XdndEnter = XInternAtom(_glfw.x11.display,"XdndEnter",0);
  _glfw.x11.XdndPosition = XInternAtom(_glfw.x11.display,"XdndPosition",0);
  _glfw.x11.XdndStatus = XInternAtom(_glfw.x11.display,"XdndStatus",0);
  _glfw.x11.XdndActionCopy = XInternAtom(_glfw.x11.display,"XdndActionCopy",0);
  _glfw.x11.XdndDrop = XInternAtom(_glfw.x11.display,"XdndDrop",0);
  _glfw.x11.XdndFinished = XInternAtom(_glfw.x11.display,"XdndFinished",0);
  _glfw.x11.XdndSelection = XInternAtom(_glfw.x11.display,"XdndSelection",0);
  _glfw.x11.XdndTypeList = XInternAtom(_glfw.x11.display,"XdndTypeList",0);
  _glfw.x11.text_uri_list = XInternAtom(_glfw.x11.display,"text/uri-list",0);
  _glfw.x11.WM_PROTOCOLS = XInternAtom(_glfw.x11.display,"WM_PROTOCOLS",0);
  _glfw.x11.WM_STATE = XInternAtom(_glfw.x11.display,"WM_STATE",0);
  _glfw.x11.WM_DELETE_WINDOW = XInternAtom(_glfw.x11.display,"WM_DELETE_WINDOW",0);
  _glfw.x11.NET_SUPPORTED = XInternAtom(_glfw.x11.display,"_NET_SUPPORTED",0);
  _glfw.x11.NET_SUPPORTING_WM_CHECK = XInternAtom(_glfw.x11.display,"_NET_SUPPORTING_WM_CHECK",0);
  _glfw.x11.NET_WM_ICON = XInternAtom(_glfw.x11.display,"_NET_WM_ICON",0);
  _glfw.x11.NET_WM_PING = XInternAtom(_glfw.x11.display,"_NET_WM_PING",0);
  _glfw.x11.NET_WM_PID = XInternAtom(_glfw.x11.display,"_NET_WM_PID",0);
  _glfw.x11.NET_WM_NAME = XInternAtom(_glfw.x11.display,"_NET_WM_NAME",0);
  _glfw.x11.NET_WM_ICON_NAME = XInternAtom(_glfw.x11.display,"_NET_WM_ICON_NAME",0);
  _glfw.x11.NET_WM_BYPASS_COMPOSITOR = XInternAtom(_glfw.x11.display,"_NET_WM_BYPASS_COMPOSITOR",0);
  _glfw.x11.NET_WM_WINDOW_OPACITY = XInternAtom(_glfw.x11.display,"_NET_WM_WINDOW_OPACITY",0);
  _glfw.x11.MOTIF_WM_HINTS = XInternAtom(_glfw.x11.display,"_MOTIF_WM_HINTS",0);
  snprintf(local_48,0x20,"_NET_WM_CM_S%u",(ulong)(uint)_glfw.x11.screen);
  _glfw.x11.NET_WM_CM_Sx = XInternAtom(_glfw.x11.display,local_48,0);
  detectEWMH();
  return 1;
}

Assistant:

static GLFWbool initExtensions(void)
{
    _glfw.x11.vidmode.handle = _glfw_dlopen("libXxf86vm.so.1");
    if (_glfw.x11.vidmode.handle)
    {
        _glfw.x11.vidmode.QueryExtension = (PFN_XF86VidModeQueryExtension)
            _glfw_dlsym(_glfw.x11.vidmode.handle, "XF86VidModeQueryExtension");
        _glfw.x11.vidmode.GetGammaRamp = (PFN_XF86VidModeGetGammaRamp)
            _glfw_dlsym(_glfw.x11.vidmode.handle, "XF86VidModeGetGammaRamp");
        _glfw.x11.vidmode.SetGammaRamp = (PFN_XF86VidModeSetGammaRamp)
            _glfw_dlsym(_glfw.x11.vidmode.handle, "XF86VidModeSetGammaRamp");
        _glfw.x11.vidmode.GetGammaRampSize = (PFN_XF86VidModeGetGammaRampSize)
            _glfw_dlsym(_glfw.x11.vidmode.handle, "XF86VidModeGetGammaRampSize");

        _glfw.x11.vidmode.available =
            XF86VidModeQueryExtension(_glfw.x11.display,
                                      &_glfw.x11.vidmode.eventBase,
                                      &_glfw.x11.vidmode.errorBase);
    }

#if defined(__CYGWIN__)
    _glfw.x11.xi.handle = _glfw_dlopen("libXi-6.so");
#else
    _glfw.x11.xi.handle = _glfw_dlopen("libXi.so.6");
#endif
    if (_glfw.x11.xi.handle)
    {
        _glfw.x11.xi.QueryVersion = (PFN_XIQueryVersion)
            _glfw_dlsym(_glfw.x11.xi.handle, "XIQueryVersion");
        _glfw.x11.xi.SelectEvents = (PFN_XISelectEvents)
            _glfw_dlsym(_glfw.x11.xi.handle, "XISelectEvents");

        if (XQueryExtension(_glfw.x11.display,
                            "XInputExtension",
                            &_glfw.x11.xi.majorOpcode,
                            &_glfw.x11.xi.eventBase,
                            &_glfw.x11.xi.errorBase))
        {
            _glfw.x11.xi.major = 2;
            _glfw.x11.xi.minor = 0;

            if (XIQueryVersion(_glfw.x11.display,
                               &_glfw.x11.xi.major,
                               &_glfw.x11.xi.minor) == Success)
            {
                _glfw.x11.xi.available = GLFW_TRUE;
            }
        }
    }

#if defined(__CYGWIN__)
    _glfw.x11.randr.handle = _glfw_dlopen("libXrandr-2.so");
#else
    _glfw.x11.randr.handle = _glfw_dlopen("libXrandr.so.2");
#endif
    if (_glfw.x11.randr.handle)
    {
        _glfw.x11.randr.AllocGamma = (PFN_XRRAllocGamma)
            _glfw_dlsym(_glfw.x11.randr.handle, "XRRAllocGamma");
        _glfw.x11.randr.FreeGamma = (PFN_XRRFreeGamma)
            _glfw_dlsym(_glfw.x11.randr.handle, "XRRFreeGamma");
        _glfw.x11.randr.FreeCrtcInfo = (PFN_XRRFreeCrtcInfo)
            _glfw_dlsym(_glfw.x11.randr.handle, "XRRFreeCrtcInfo");
        _glfw.x11.randr.FreeGamma = (PFN_XRRFreeGamma)
            _glfw_dlsym(_glfw.x11.randr.handle, "XRRFreeGamma");
        _glfw.x11.randr.FreeOutputInfo = (PFN_XRRFreeOutputInfo)
            _glfw_dlsym(_glfw.x11.randr.handle, "XRRFreeOutputInfo");
        _glfw.x11.randr.FreeScreenResources = (PFN_XRRFreeScreenResources)
            _glfw_dlsym(_glfw.x11.randr.handle, "XRRFreeScreenResources");
        _glfw.x11.randr.GetCrtcGamma = (PFN_XRRGetCrtcGamma)
            _glfw_dlsym(_glfw.x11.randr.handle, "XRRGetCrtcGamma");
        _glfw.x11.randr.GetCrtcGammaSize = (PFN_XRRGetCrtcGammaSize)
            _glfw_dlsym(_glfw.x11.randr.handle, "XRRGetCrtcGammaSize");
        _glfw.x11.randr.GetCrtcInfo = (PFN_XRRGetCrtcInfo)
            _glfw_dlsym(_glfw.x11.randr.handle, "XRRGetCrtcInfo");
        _glfw.x11.randr.GetOutputInfo = (PFN_XRRGetOutputInfo)
            _glfw_dlsym(_glfw.x11.randr.handle, "XRRGetOutputInfo");
        _glfw.x11.randr.GetOutputPrimary = (PFN_XRRGetOutputPrimary)
            _glfw_dlsym(_glfw.x11.randr.handle, "XRRGetOutputPrimary");
        _glfw.x11.randr.GetScreenResourcesCurrent = (PFN_XRRGetScreenResourcesCurrent)
            _glfw_dlsym(_glfw.x11.randr.handle, "XRRGetScreenResourcesCurrent");
        _glfw.x11.randr.QueryExtension = (PFN_XRRQueryExtension)
            _glfw_dlsym(_glfw.x11.randr.handle, "XRRQueryExtension");
        _glfw.x11.randr.QueryVersion = (PFN_XRRQueryVersion)
            _glfw_dlsym(_glfw.x11.randr.handle, "XRRQueryVersion");
        _glfw.x11.randr.SelectInput = (PFN_XRRSelectInput)
            _glfw_dlsym(_glfw.x11.randr.handle, "XRRSelectInput");
        _glfw.x11.randr.SetCrtcConfig = (PFN_XRRSetCrtcConfig)
            _glfw_dlsym(_glfw.x11.randr.handle, "XRRSetCrtcConfig");
        _glfw.x11.randr.SetCrtcGamma = (PFN_XRRSetCrtcGamma)
            _glfw_dlsym(_glfw.x11.randr.handle, "XRRSetCrtcGamma");
        _glfw.x11.randr.UpdateConfiguration = (PFN_XRRUpdateConfiguration)
            _glfw_dlsym(_glfw.x11.randr.handle, "XRRUpdateConfiguration");

        if (XRRQueryExtension(_glfw.x11.display,
                              &_glfw.x11.randr.eventBase,
                              &_glfw.x11.randr.errorBase))
        {
            if (XRRQueryVersion(_glfw.x11.display,
                                &_glfw.x11.randr.major,
                                &_glfw.x11.randr.minor))
            {
                // The GLFW RandR path requires at least version 1.3
                if (_glfw.x11.randr.major > 1 || _glfw.x11.randr.minor >= 3)
                    _glfw.x11.randr.available = GLFW_TRUE;
            }
            else
            {
                _glfwInputError(GLFW_PLATFORM_ERROR,
                                "X11: Failed to query RandR version");
            }
        }
    }

    if (_glfw.x11.randr.available)
    {
        XRRScreenResources* sr = XRRGetScreenResourcesCurrent(_glfw.x11.display,
                                                              _glfw.x11.root);

        if (!sr->ncrtc || !XRRGetCrtcGammaSize(_glfw.x11.display, sr->crtcs[0]))
        {
            // This is likely an older Nvidia driver with broken gamma support
            // Flag it as useless and fall back to xf86vm gamma, if available
            _glfw.x11.randr.gammaBroken = GLFW_TRUE;
        }

        if (!sr->ncrtc)
        {
            // A system without CRTCs is likely a system with broken RandR
            // Disable the RandR monitor path and fall back to core functions
            _glfw.x11.randr.monitorBroken = GLFW_TRUE;
        }

        XRRFreeScreenResources(sr);
    }

    if (_glfw.x11.randr.available && !_glfw.x11.randr.monitorBroken)
    {
        XRRSelectInput(_glfw.x11.display, _glfw.x11.root,
                       RROutputChangeNotifyMask);
    }

#if defined(__CYGWIN__)
    _glfw.x11.xcursor.handle = _glfw_dlopen("libXcursor-1.so");
#else
    _glfw.x11.xcursor.handle = _glfw_dlopen("libXcursor.so.1");
#endif
    if (_glfw.x11.xcursor.handle)
    {
        _glfw.x11.xcursor.ImageCreate = (PFN_XcursorImageCreate)
            _glfw_dlsym(_glfw.x11.xcursor.handle, "XcursorImageCreate");
        _glfw.x11.xcursor.ImageDestroy = (PFN_XcursorImageDestroy)
            _glfw_dlsym(_glfw.x11.xcursor.handle, "XcursorImageDestroy");
        _glfw.x11.xcursor.ImageLoadCursor = (PFN_XcursorImageLoadCursor)
            _glfw_dlsym(_glfw.x11.xcursor.handle, "XcursorImageLoadCursor");
    }

#if defined(__CYGWIN__)
    _glfw.x11.xinerama.handle = _glfw_dlopen("libXinerama-1.so");
#else
    _glfw.x11.xinerama.handle = _glfw_dlopen("libXinerama.so.1");
#endif
    if (_glfw.x11.xinerama.handle)
    {
        _glfw.x11.xinerama.IsActive = (PFN_XineramaIsActive)
            _glfw_dlsym(_glfw.x11.xinerama.handle, "XineramaIsActive");
        _glfw.x11.xinerama.QueryExtension = (PFN_XineramaQueryExtension)
            _glfw_dlsym(_glfw.x11.xinerama.handle, "XineramaQueryExtension");
        _glfw.x11.xinerama.QueryScreens = (PFN_XineramaQueryScreens)
            _glfw_dlsym(_glfw.x11.xinerama.handle, "XineramaQueryScreens");

        if (XineramaQueryExtension(_glfw.x11.display,
                                   &_glfw.x11.xinerama.major,
                                   &_glfw.x11.xinerama.minor))
        {
            if (XineramaIsActive(_glfw.x11.display))
                _glfw.x11.xinerama.available = GLFW_TRUE;
        }
    }

    _glfw.x11.xkb.major = 1;
    _glfw.x11.xkb.minor = 0;
    _glfw.x11.xkb.available =
        XkbQueryExtension(_glfw.x11.display,
                          &_glfw.x11.xkb.majorOpcode,
                          &_glfw.x11.xkb.eventBase,
                          &_glfw.x11.xkb.errorBase,
                          &_glfw.x11.xkb.major,
                          &_glfw.x11.xkb.minor);

    if (_glfw.x11.xkb.available)
    {
        Bool supported;

        if (XkbSetDetectableAutoRepeat(_glfw.x11.display, True, &supported))
        {
            if (supported)
                _glfw.x11.xkb.detectable = GLFW_TRUE;
        }

        _glfw.x11.xkb.group = 0;
        XkbStateRec state;
        if (XkbGetState(_glfw.x11.display, XkbUseCoreKbd, &state) == Success)
        {
            XkbSelectEventDetails(_glfw.x11.display, XkbUseCoreKbd, XkbStateNotify, XkbAllStateComponentsMask, XkbGroupStateMask);
            _glfw.x11.xkb.group = (unsigned int)state.group;
        }
    }

#if defined(__CYGWIN__)
    _glfw.x11.x11xcb.handle = _glfw_dlopen("libX11-xcb-1.so");
#else
    _glfw.x11.x11xcb.handle = _glfw_dlopen("libX11-xcb.so.1");
#endif
    if (_glfw.x11.x11xcb.handle)
    {
        _glfw.x11.x11xcb.GetXCBConnection = (PFN_XGetXCBConnection)
            _glfw_dlsym(_glfw.x11.x11xcb.handle, "XGetXCBConnection");
    }

#if defined(__CYGWIN__)
    _glfw.x11.xrender.handle = _glfw_dlopen("libXrender-1.so");
#else
    _glfw.x11.xrender.handle = _glfw_dlopen("libXrender.so.1");
#endif
    if (_glfw.x11.xrender.handle)
    {
        _glfw.x11.xrender.QueryExtension = (PFN_XRenderQueryExtension)
            _glfw_dlsym(_glfw.x11.xrender.handle, "XRenderQueryExtension");
        _glfw.x11.xrender.QueryVersion = (PFN_XRenderQueryVersion)
            _glfw_dlsym(_glfw.x11.xrender.handle, "XRenderQueryVersion");
        _glfw.x11.xrender.FindVisualFormat = (PFN_XRenderFindVisualFormat)
            _glfw_dlsym(_glfw.x11.xrender.handle, "XRenderFindVisualFormat");

        if (XRenderQueryExtension(_glfw.x11.display,
                                  &_glfw.x11.xrender.errorBase,
                                  &_glfw.x11.xrender.eventBase))
        {
            if (XRenderQueryVersion(_glfw.x11.display,
                                    &_glfw.x11.xrender.major,
                                    &_glfw.x11.xrender.minor))
            {
                _glfw.x11.xrender.available = GLFW_TRUE;
            }
        }
    }

    // Update the key code LUT
    // FIXME: We should listen to XkbMapNotify events to track changes to
    // the keyboard mapping.
    createKeyTables();

    // String format atoms
    _glfw.x11.NULL_ = XInternAtom(_glfw.x11.display, "NULL", False);
    _glfw.x11.UTF8_STRING = XInternAtom(_glfw.x11.display, "UTF8_STRING", False);
    _glfw.x11.ATOM_PAIR = XInternAtom(_glfw.x11.display, "ATOM_PAIR", False);

    // Custom selection property atom
    _glfw.x11.GLFW_SELECTION =
        XInternAtom(_glfw.x11.display, "GLFW_SELECTION", False);

    // ICCCM standard clipboard atoms
    _glfw.x11.TARGETS = XInternAtom(_glfw.x11.display, "TARGETS", False);
    _glfw.x11.MULTIPLE = XInternAtom(_glfw.x11.display, "MULTIPLE", False);
    _glfw.x11.PRIMARY = XInternAtom(_glfw.x11.display, "PRIMARY", False);
    _glfw.x11.INCR = XInternAtom(_glfw.x11.display, "INCR", False);
    _glfw.x11.CLIPBOARD = XInternAtom(_glfw.x11.display, "CLIPBOARD", False);

    // Clipboard manager atoms
    _glfw.x11.CLIPBOARD_MANAGER =
        XInternAtom(_glfw.x11.display, "CLIPBOARD_MANAGER", False);
    _glfw.x11.SAVE_TARGETS =
        XInternAtom(_glfw.x11.display, "SAVE_TARGETS", False);

    // Xdnd (drag and drop) atoms
    _glfw.x11.XdndAware = XInternAtom(_glfw.x11.display, "XdndAware", False);
    _glfw.x11.XdndEnter = XInternAtom(_glfw.x11.display, "XdndEnter", False);
    _glfw.x11.XdndPosition = XInternAtom(_glfw.x11.display, "XdndPosition", False);
    _glfw.x11.XdndStatus = XInternAtom(_glfw.x11.display, "XdndStatus", False);
    _glfw.x11.XdndActionCopy = XInternAtom(_glfw.x11.display, "XdndActionCopy", False);
    _glfw.x11.XdndDrop = XInternAtom(_glfw.x11.display, "XdndDrop", False);
    _glfw.x11.XdndFinished = XInternAtom(_glfw.x11.display, "XdndFinished", False);
    _glfw.x11.XdndSelection = XInternAtom(_glfw.x11.display, "XdndSelection", False);
    _glfw.x11.XdndTypeList = XInternAtom(_glfw.x11.display, "XdndTypeList", False);
    _glfw.x11.text_uri_list = XInternAtom(_glfw.x11.display, "text/uri-list", False);

    // ICCCM, EWMH and Motif window property atoms
    // These can be set safely even without WM support
    // The EWMH atoms that require WM support are handled in detectEWMH
    _glfw.x11.WM_PROTOCOLS =
        XInternAtom(_glfw.x11.display, "WM_PROTOCOLS", False);
    _glfw.x11.WM_STATE =
        XInternAtom(_glfw.x11.display, "WM_STATE", False);
    _glfw.x11.WM_DELETE_WINDOW =
        XInternAtom(_glfw.x11.display, "WM_DELETE_WINDOW", False);
    _glfw.x11.NET_SUPPORTED =
        XInternAtom(_glfw.x11.display, "_NET_SUPPORTED", False);
    _glfw.x11.NET_SUPPORTING_WM_CHECK =
        XInternAtom(_glfw.x11.display, "_NET_SUPPORTING_WM_CHECK", False);
    _glfw.x11.NET_WM_ICON =
        XInternAtom(_glfw.x11.display, "_NET_WM_ICON", False);
    _glfw.x11.NET_WM_PING =
        XInternAtom(_glfw.x11.display, "_NET_WM_PING", False);
    _glfw.x11.NET_WM_PID =
        XInternAtom(_glfw.x11.display, "_NET_WM_PID", False);
    _glfw.x11.NET_WM_NAME =
        XInternAtom(_glfw.x11.display, "_NET_WM_NAME", False);
    _glfw.x11.NET_WM_ICON_NAME =
        XInternAtom(_glfw.x11.display, "_NET_WM_ICON_NAME", False);
    _glfw.x11.NET_WM_BYPASS_COMPOSITOR =
        XInternAtom(_glfw.x11.display, "_NET_WM_BYPASS_COMPOSITOR", False);
    _glfw.x11.NET_WM_WINDOW_OPACITY =
        XInternAtom(_glfw.x11.display, "_NET_WM_WINDOW_OPACITY", False);
    _glfw.x11.MOTIF_WM_HINTS =
        XInternAtom(_glfw.x11.display, "_MOTIF_WM_HINTS", False);

    // The compositing manager selection name contains the screen number
    {
        char name[32];
        snprintf(name, sizeof(name), "_NET_WM_CM_S%u", _glfw.x11.screen);
        _glfw.x11.NET_WM_CM_Sx = XInternAtom(_glfw.x11.display, name, False);
    }

    // Detect whether an EWMH-conformant window manager is running
    detectEWMH();

    return GLFW_TRUE;
}